

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

void addCommandDefinition(CommandInfo *comm)

{
  bool bVar1;
  reference ppCVar2;
  CommandInfo **ppCVar3;
  CommandInfo *it;
  Iterator __end1;
  Iterator __begin1;
  List<CommandInfo_*> *__range1;
  CommandInfo *comm_local;
  
  __range1 = (List<CommandInfo_*> *)comm;
  List<CommandInfo_*>::begin((Iterator *)&__end1._M_node,&Commands);
  List<CommandInfo_*>::end((Iterator *)&it,&Commands);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&it);
    if (!bVar1) break;
    ppCVar2 = std::_Deque_iterator<CommandInfo_*,_CommandInfo_*&,_CommandInfo_**>::operator*
                        ((_Deque_iterator<CommandInfo_*,_CommandInfo_*&,_CommandInfo_**> *)
                         &__end1._M_node);
    if (((*ppCVar2)->number ==
         *(int *)&(__range1->_deque).
                  super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
                  super__Deque_impl_data._M_start._M_last) &&
       (((*ppCVar2)->isbuiltin & 1U) ==
        (*(byte *)&__range1[2]._deque.
                   super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>._M_impl.
                   super__Deque_impl_data._M_map & 1))) {
      ppCVar3 = List<CommandInfo_*>::operator[]
                          (&Commands,
                           *(int *)&(__range1->_deque).
                                    super__Deque_base<CommandInfo_*,_std::allocator<CommandInfo_*>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_last);
      error<String,String>
                ("Attempted to redefine command #%1 (%2) as %3",&(*ppCVar3)->name,(String *)__range1
                );
    }
    std::_Deque_iterator<CommandInfo_*,_CommandInfo_*&,_CommandInfo_**>::operator++
              ((_Deque_iterator<CommandInfo_*,_CommandInfo_*&,_CommandInfo_**> *)&__end1._M_node);
  }
  List<CommandInfo_*>::operator<<(&Commands,(CommandInfo **)&__range1);
  return;
}

Assistant:

void addCommandDefinition (CommandInfo* comm)
{
	// Ensure that there is no conflicts
	for (CommandInfo* it : Commands)
	{
		if (it->number == comm->number && it->isbuiltin == comm->isbuiltin)
		{
			error ("Attempted to redefine command #%1 (%2) as %3",
				   Commands[comm->number]->name, comm->name);
		}
	}

	Commands << comm;
}